

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_GLSL_TEXM3X3SPEC(Context *ctx)

{
  bool bVar1;
  uint uVar2;
  RegisterList *pRVar3;
  size_t len;
  RegisterList *extraout_RDX;
  RegisterList *pRVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  char sampler [64];
  char src4 [64];
  char src3 [64];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char code [512];
  char src5 [64];
  char dst [64];
  
  if (ctx->texm3x3pad_src1 != -1) {
    emit_GLSL_TEXM3X3SPEC_helper(ctx);
    snprintf(code,0x10,"%u",(ulong)(uint)(ctx->dest_arg).regnum);
    snprintf(sampler,0x40,"%s_%s%s",ctx->shader_type_str,"s",code);
    pcVar7 = "t";
    pcVar6 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar6 = "a";
    }
    snprintf(code,0x10,"%u",(ulong)(uint)ctx->texm3x3pad_dst0);
    snprintf(src0,0x40,"%s_%s%s",ctx->shader_type_str,pcVar6,code);
    pcVar6 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar6 = "a";
    }
    snprintf(code,0x10,"%u",(ulong)(uint)ctx->texm3x3pad_src0);
    snprintf(src1,0x40,"%s_%s%s",ctx->shader_type_str,pcVar6,code);
    pcVar6 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar6 = "a";
    }
    snprintf(code,0x10,"%u",(ulong)(uint)ctx->texm3x3pad_dst1);
    snprintf(src2,0x40,"%s_%s%s",ctx->shader_type_str,pcVar6,code);
    pcVar6 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar6 = "a";
    }
    snprintf(code,0x10,"%u",(ulong)(uint)ctx->texm3x3pad_src1);
    snprintf(src3,0x40,"%s_%s%s",ctx->shader_type_str,pcVar6,code);
    pcVar6 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar6 = "a";
    }
    snprintf(code,0x10,"%u",(ulong)(uint)ctx->source_args[0].regnum);
    snprintf(src4,0x40,"%s_%s%s",ctx->shader_type_str,pcVar6,code);
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar7 = "a";
    }
    snprintf(code,0x10,"%u",(ulong)(uint)ctx->source_args[1].regnum);
    snprintf(src5,0x40,"%s_%s%s",ctx->shader_type_str,pcVar7,code);
    get_GLSL_destarg_varname(ctx,dst,len);
    uVar2 = (ctx->dest_arg).regnum | 0xa0000;
    pRVar3 = (ctx->samplers).next;
    pRVar4 = extraout_RDX;
    do {
      if (pRVar3 == (RegisterList *)0x0) {
        pRVar4 = (RegisterList *)0x0;
        break;
      }
      uVar5 = pRVar3->regtype << 0x10 | pRVar3->regnum;
      if (uVar2 == uVar5) {
        bVar1 = false;
        pRVar4 = pRVar3;
      }
      else if (uVar2 < uVar5) {
        pRVar4 = (RegisterList *)0x0;
        bVar1 = false;
      }
      else {
        pRVar3 = pRVar3->next;
        bVar1 = true;
      }
    } while (bVar1);
    if (pRVar4 == (RegisterList *)0x0) {
      pcVar6 = "3D";
    }
    else {
      pcVar6 = "3D";
      if (pRVar4->index == 3) {
        pcVar6 = "Cube";
      }
    }
    make_GLSL_destarg_assign
              (ctx,code,0x200,
               "texture%s(%s, TEXM3X3SPEC_reflection(vec3(dot(%s.xyz, %s.xyz), dot(%s.xyz, %s.xyz), dot(%s.xyz, %s.xyz)),%s.xyz,))"
               ,pcVar6,sampler,src0,src1,src2,src3,dst,src4,src5);
    output_line(ctx,"%s",code);
  }
  return;
}

Assistant:

static void emit_GLSL_TEXM3X3SPEC(Context *ctx)
{
    if (ctx->texm3x3pad_src1 == -1)
        return;

    DestArgInfo *info = &ctx->dest_arg;
    char dst[64];
    char src0[64];
    char src1[64];
    char src2[64];
    char src3[64];
    char src4[64];
    char src5[64];
    char sampler[64];
    char code[512];

    emit_GLSL_TEXM3X3SPEC_helper(ctx);

    // !!! FIXME: this code counts on the register not having swizzles, etc.
    get_GLSL_varname_in_buf(ctx, REG_TYPE_SAMPLER, info->regnum,
                            sampler, sizeof (sampler));

    get_GLSL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_dst0,
                            src0, sizeof (src0));
    get_GLSL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_src0,
                            src1, sizeof (src1));
    get_GLSL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_dst1,
                            src2, sizeof (src2));
    get_GLSL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_src1,
                            src3, sizeof (src3));
    get_GLSL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->source_args[0].regnum,
                            src4, sizeof (src4));
    get_GLSL_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->source_args[1].regnum,
                            src5, sizeof (src5));
    get_GLSL_destarg_varname(ctx, dst, sizeof (dst));

    RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER,
                                      info->regnum);
    const TextureType ttype = (TextureType) (sreg ? sreg->index : 0);
    const char *ttypestr = (ttype == TEXTURE_TYPE_CUBE) ? "Cube" : "3D";

    make_GLSL_destarg_assign(ctx, code, sizeof (code),
        "texture%s(%s, "
            "TEXM3X3SPEC_reflection("
                "vec3("
                    "dot(%s.xyz, %s.xyz), "
                    "dot(%s.xyz, %s.xyz), "
                    "dot(%s.xyz, %s.xyz)"
                "),"
                "%s.xyz,"
            ")"
        ")",
        ttypestr, sampler, src0, src1, src2, src3, dst, src4, src5);

    output_line(ctx, "%s", code);
}